

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O2

void bron_kerbosch(set<int,_std::less<int>,_std::allocator<int>_> *R,
                  set<int,_std::less<int>,_std::allocator<int>_> *P,
                  set<int,_std::less<int>,_std::allocator<int>_> *X)

{
  _Base_ptr p_Var1;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> newR;
  set<int,_std::less<int>,_std::allocator<int>_> newX;
  set<int,_std::less<int>,_std::allocator<int>_> newP;
  set<int,_std::less<int>,_std::allocator<int>_> foriterate;
  _Rb_tree_color local_1a4;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_1a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_198;
  _Rb_tree_header *local_190;
  _Rb_tree_header *local_188;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_180;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_150;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_120;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_1a0 = &R->_M_t;
  if (((P->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     ((X->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    local_f0._M_impl._0_8_ = (R->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_180._M_impl._0_8_ = &(R->_M_t)._M_impl.super__Rb_tree_header;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&(anonymous_namespace)::cliques,(_Rb_tree_const_iterator<int> *)&local_f0,
               (_Rb_tree_const_iterator<int> *)&local_180);
  }
  else {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_f0,&P->_M_t);
    local_188 = &(P->_M_t)._M_impl.super__Rb_tree_header;
    local_190 = &(X->_M_t)._M_impl.super__Rb_tree_header;
    p_Var1 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_198 = &P->_M_t;
    for (; p_Var1 != (_Rb_tree_node_base *)((long)&local_f0 + 8U);
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      local_1a4 = p_Var1[1]._M_color;
      local_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_180._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_180._M_impl.super__Rb_tree_header._M_header;
      local_180._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_120._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_120._M_impl.super__Rb_tree_header._M_header;
      local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_150._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_150._M_impl.super__Rb_tree_header._M_header;
      local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_180._M_impl.super__Rb_tree_header._M_header._M_right =
           local_180._M_impl.super__Rb_tree_header._M_header._M_left;
      local_150._M_impl.super__Rb_tree_header._M_header._M_right =
           local_150._M_impl.super__Rb_tree_header._M_header._M_left;
      local_120._M_impl.super__Rb_tree_header._M_header._M_right =
           local_120._M_impl.super__Rb_tree_header._M_header._M_left;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
                (&local_180,local_1a0);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_180,(int *)&local_1a4);
      std::
      __set_intersection<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((((_Rep_type *)&local_198->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                 _M_left,local_188,
                 edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,edge.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,&local_120,
                 local_120._M_impl.super__Rb_tree_header._M_header._M_left);
      std::
      __set_intersection<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((X->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,local_190,
                 edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,edge.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)local_1a4].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,&local_150,
                 local_150._M_impl.super__Rb_tree_header._M_header._M_left);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_c0,&local_180);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_60,&local_120);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_90,&local_150);
      bron_kerbosch((set<int,_std::less<int>,_std::allocator<int>_> *)&local_c0,
                    (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                    (set<int,_std::less<int>,_std::allocator<int>_> *)&local_90);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_90);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_c0);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (local_198,(key_type *)&local_1a4);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)X,
                 (int *)&local_1a4);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_150);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_120);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_180);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_f0);
  }
  return;
}

Assistant:

void bron_kerbosch(set <int> R, set <int> P, set <int> X) { // where R is probable clique, P - possible vertices in clique, X - exluded vertices
    if (P.empty() && X.empty()) { // R is maximal clique
        cliques.emplace_back(R.begin(), R.end());
    }
    else {
        set <int> foriterate = P;
        for (auto i : foriterate) {
            set <int> newR;
            set <int> newP;
            set <int> newX;

            newR = R;
            newR.insert(i);

            set_intersection(P.begin(), P.end(), edge[i].begin(), edge[i].end(), inserter(newP, newP.begin()));

            set_intersection(X.begin(), X.end(), edge[i].begin(), edge[i].end(), inserter(newX, newX.begin()));

            bron_kerbosch(newR, newP, newX);

            P.erase(i);
            X.insert(i);
        }
    }
}